

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O0

Position __thiscall tli_window_manager::Text::current_position(Text *this)

{
  char *pcVar1;
  pair<int,_int> pVar2;
  Position PVar3;
  int local_28;
  int local_24;
  int i_1;
  int col;
  int i;
  int row;
  Text *this_local;
  
  col = 0;
  _i = this;
  for (i_1 = this->index_; i_1 < this->cursor_position_; i_1 = i_1 + 1) {
    pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)&this->buffer_);
    if (*pcVar1 == '\n') {
      col = col + 1;
    }
  }
  local_24 = 0;
  local_28 = this->cursor_position_;
  while ((this->index_ < local_28 &&
         (pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)&this->buffer_), *pcVar1 != '\n')
         )) {
    local_24 = local_24 + 1;
    local_28 = local_28 + -1;
  }
  pVar2 = std::make_pair<int&,int&>(&col,&local_24);
  PVar3.first = pVar2.first;
  PVar3.second = pVar2.second;
  return PVar3;
}

Assistant:

Position Text::current_position() const {
    int row = 0;
    for (int i = index_; i < cursor_position_; ++i) {
        if (buffer_[i] == '\n') {
            ++row;
        }
    }

    int col = 0;
    for (int i = cursor_position_; i > index_; --i) {
        if (buffer_[i] != '\n') {
            ++col;
        } else {
            break;
        }
    }
    return std::make_pair(row, col);
}